

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalCreateThread
                    (CPalThread *pThread,LPSECURITY_ATTRIBUTES lpThreadAttributes,DWORD dwStackSize,
                    LPTHREAD_START_ROUTINE lpStartAddress,LPVOID lpParameter,DWORD dwCreationFlags,
                    PalThreadType eThreadType,SIZE_T *pThreadId,HANDLE *phThread)

{
  bool bVar1;
  HANDLE pThread_00;
  bool bVar2;
  PAL_ERROR PVar3;
  int iVar4;
  CPalThread *this;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  pthread_t local_90;
  pthread_t pthread;
  HANDLE hNewThread;
  ulong local_78;
  size_t alignedStackSize;
  pthread_attr_t pthreadAttr;
  
  pthreadAttr._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pthread = 0;
  if (lpThreadAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    local_78 = (ulong)dwStackSize;
    uVar6 = local_78;
    if ((dwStackSize != 0) && (uVar6 = local_78 + 0xfff & 0xfffffffffffff000, uVar6 < local_78)) {
      pcVar8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/include/pal/utils.h"
      ;
      pcVar9 = "result >= val";
      uVar7 = 0x28;
LAB_0034e774:
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",pcVar8,uVar7,pcVar9,"");
      fflush(_stderr);
      goto LAB_0034e783;
    }
    local_78 = uVar6;
    if ((dwCreationFlags & 0xfffefffb) == 0) {
      this = AllocTHREAD();
      if (this == (CPalThread *)0x0) {
        PVar3 = 0xe;
        goto LAB_0034e484;
      }
      hNewThread = pThread;
      PVar3 = CPalThread::RunPreCreateInitializers(this);
      if (PVar3 != 0) goto LAB_0034e484;
      this->m_lpStartAddress = lpStartAddress;
      this->m_lpStartParameter = lpParameter;
      this->m_bCreateSuspended = dwCreationFlags >> 2 & 1;
      this->m_eThreadType = eThreadType;
      iVar4 = pthread_attr_init((pthread_attr_t *)&alignedStackSize);
      if (iVar4 != 0) {
        PVar3 = 0x54f;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
        goto LAB_0034e484;
      }
      iVar4 = pthread_attr_getstacksize((pthread_attr_t *)&alignedStackSize,&local_78);
      pThread_00 = hNewThread;
      if (iVar4 == 0) {
        if (local_78 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
        }
        else {
          sVar5 = __sysconf(0x4b);
          sVar5 = ALIGN_UP(sVar5,0x1000);
          if (local_78 < sVar5) {
            local_78 = sVar5;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
          iVar4 = pthread_attr_setstacksize((pthread_attr_t *)&alignedStackSize,local_78);
          if (iVar4 != 0) goto joined_r0x0034e5fa;
        }
        iVar4 = pthread_attr_setdetachstate((pthread_attr_t *)&alignedStackSize,1);
        if (iVar4 != 0) {
          pcVar8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
          ;
          pcVar9 = "0 == iError";
          uVar7 = 0x27e;
          goto LAB_0034e774;
        }
        PVar3 = CreateThreadObject((CPalThread *)pThread_00,this,(HANDLE *)&pthread);
        if (PVar3 != 0) goto LAB_0034e556;
        PROCProcessLock();
        PROCAddThread((CPalThread *)pThread_00,this);
        iVar4 = pthread_create(&local_90,(pthread_attr_t *)&alignedStackSize,CPalThread::ThreadEntry
                               ,this);
        if (iVar4 == 0) {
          bVar2 = CPalThread::WaitForStartStatus(this);
          if (bVar2) {
            *phThread = (HANDLE)pthread;
            if (pThreadId != (SIZE_T *)0x0) {
              *pThreadId = this->m_threadId;
            }
            PROCProcessUnlock();
            bVar2 = true;
            PVar3 = 0;
            bVar1 = true;
            goto LAB_0034e559;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
          PVar3 = 0x54f;
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
          strerror(iVar4);
          PVar3 = 8;
        }
        bVar2 = true;
        bVar1 = false;
      }
      else {
joined_r0x0034e5fa:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034e783;
        PVar3 = 0x54f;
LAB_0034e556:
        bVar1 = true;
        bVar2 = false;
      }
LAB_0034e559:
      iVar4 = pthread_attr_destroy((pthread_attr_t *)&alignedStackSize);
      if ((iVar4 != 0) && (PAL_InitializeChakraCoreCalled == false)) {
LAB_0034e783:
        abort();
      }
      if (PVar3 == 0) {
        PVar3 = 0;
        if (!bVar1) {
          PVar3 = 0;
          fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                  ,0x2fa);
          fprintf(_stderr,
                  "Expression: !fHoldingProcessLock, Description: Exiting InternalCreateThread while still holding the process critical section.\n"
                 );
        }
      }
      else {
        if (bVar2) {
          PROCRemoveThread((CPalThread *)pThread_00,this);
        }
        if (!bVar1) {
          PROCProcessUnlock();
        }
      }
      goto LAB_0034e484;
    }
    fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x229);
    fprintf(_stderr,"dwCreationFlags parameter is invalid (%#x)\n",
            (ulong)(dwCreationFlags & 0xfffeffff));
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x20e);
    fprintf(_stderr,"lpThreadAttributes parameter must be NULL (%p)\n",lpThreadAttributes);
  }
  PVar3 = 0x57;
LAB_0034e484:
  if (*(long *)(in_FS_OFFSET + 0x28) != pthreadAttr._48_8_) {
    __stack_chk_fail();
  }
  return PVar3;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateThread(
    CPalThread *pThread,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    DWORD dwStackSize,
    LPTHREAD_START_ROUTINE lpStartAddress,
    LPVOID lpParameter,
    DWORD dwCreationFlags,
    PalThreadType eThreadType,
    SIZE_T* pThreadId,
    HANDLE *phThread
    )
{
    PAL_ERROR palError;
    CPalThread *pNewThread = NULL;
    CObjectAttributes oa;
    bool fAttributesInitialized = FALSE;
    bool fThreadDataAddedToProcessList = FALSE;
    HANDLE hNewThread = NULL;

    pthread_t pthread;
    pthread_attr_t pthreadAttr;
#if PTHREAD_CREATE_MODIFIES_ERRNO
    int storedErrno;
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO
    BOOL fHoldingProcessLock = FALSE;
    int iError = 0;
    size_t alignedStackSize;

    /* Validate parameters */

    if (lpThreadAttributes != NULL)
    {
        ASSERT("lpThreadAttributes parameter must be NULL (%p)\n",
               lpThreadAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto EXIT;
    }

    alignedStackSize = dwStackSize;
    if (alignedStackSize != 0)
    {
        // Some systems require the stack size to be aligned to the page size
        if (sizeof(alignedStackSize) <= sizeof(dwStackSize) && alignedStackSize + (VIRTUAL_PAGE_SIZE - 1) < alignedStackSize)
        {
            // When coming here from the public API surface, the incoming value is originally a nonnegative signed int32, so
            // this shouldn't happen
            ASSERT(
                "Couldn't align the requested stack size (%zu) to the page size because the stack size was too large\n",
                alignedStackSize);
            palError = ERROR_INVALID_PARAMETER;
            goto EXIT;
        }
        alignedStackSize = ALIGN_UP(alignedStackSize, VIRTUAL_PAGE_SIZE);
    }

    // Ignore the STACK_SIZE_PARAM_IS_A_RESERVATION flag
    dwCreationFlags &= ~STACK_SIZE_PARAM_IS_A_RESERVATION;

    if ((dwCreationFlags != 0) && (dwCreationFlags != CREATE_SUSPENDED))
    {
        ASSERT("dwCreationFlags parameter is invalid (%#x)\n", dwCreationFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto EXIT;
    }

    //
    // Create the CPalThread for the thread
    //

    pNewThread = AllocTHREAD();
    if (NULL == pNewThread)
    {
        palError = ERROR_OUTOFMEMORY;
        goto EXIT;
    }

    palError = pNewThread->RunPreCreateInitializers();
    if (NO_ERROR != palError)
    {
        goto EXIT;
    }

    pNewThread->m_lpStartAddress = lpStartAddress;
    pNewThread->m_lpStartParameter = lpParameter;
    pNewThread->m_bCreateSuspended = (dwCreationFlags & CREATE_SUSPENDED) == CREATE_SUSPENDED;
    pNewThread->m_eThreadType = eThreadType;

    if (0 != pthread_attr_init(&pthreadAttr))
    {
        ERROR("couldn't initialize pthread attributes\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    fAttributesInitialized = TRUE;

    /* adjust the stack size if necessary */
    if (0 != pthread_attr_getstacksize(&pthreadAttr, &alignedStackSize))
    {
        ERROR("couldn't set thread stack size\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    /* adjust the stack size if necessary */
    if (alignedStackSize != 0)
    {
#ifdef PTHREAD_STACK_MIN
        size_t MinStackSize = ALIGN_UP(PTHREAD_STACK_MIN, VIRTUAL_PAGE_SIZE);
#else // !PTHREAD_STACK_MIN
        size_t MinStackSize = 64 * 1024; // this value is typically accepted by pthread_attr_setstacksize()
#endif // PTHREAD_STACK_MIN
        if (alignedStackSize < MinStackSize)
        {
            // Adjust the stack size to a minimum value that is likely to be accepted by pthread_attr_setstacksize(). If this
            // function fails, typically the caller will end up throwing OutOfMemoryException under the assumption that the
            // requested stack size is too large or the system does not have sufficient memory to create a thread. Try to
            // prevent failing just just because the stack size value is too low.
            alignedStackSize = MinStackSize;
        }

        TRACE("setting thread stack size to %zu\n", alignedStackSize);
        if (0 != pthread_attr_setstacksize(&pthreadAttr, alignedStackSize))
        {
            ERROR("couldn't set pthread stack size to %zu\n", alignedStackSize);
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
    }
    else
    {
        TRACE("using the system default thread stack size\n");
    }

#if HAVE_THREAD_SELF || HAVE__LWP_SELF
    /* Create new threads as "bound", so each pthread is permanently bound
       to an LWP.  Get/SetThreadContext() depend on this 1:1 mapping. */
    pthread_attr_setscope(&pthreadAttr, PTHREAD_SCOPE_SYSTEM);
#endif // HAVE_THREAD_SELF || HAVE__LWP_SELF

    //
    // We never call pthread_join, so create the new thread as detached
    //

    iError = pthread_attr_setdetachstate(&pthreadAttr, PTHREAD_CREATE_DETACHED);
    _ASSERTE(0 == iError);

    //
    // Create the IPalObject for the thread and store it in the object
    //

    palError = CreateThreadObject(
        pThread,
        pNewThread,
        &hNewThread);

    if (NO_ERROR != palError)
    {
        goto EXIT;
    }

    //
    // Add the thread to the process list
    //

    //
    // We use the process lock to ensure that we're not interrupted
    // during the creation process. After adding the CPalThread reference
    // to the process list, we want to make sure the actual thread has been
    // started. Otherwise, there's a window where the thread can be found
    // in the process list but doesn't yet exist in the system.
    //

    PROCProcessLock();
    fHoldingProcessLock = TRUE;

    PROCAddThread(pThread, pNewThread);
    fThreadDataAddedToProcessList = TRUE;

    //
    // Spawn the new pthread
    //

#if PTHREAD_CREATE_MODIFIES_ERRNO
    storedErrno = errno;
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO

    iError = pthread_create(&pthread, &pthreadAttr, CPalThread::ThreadEntry, pNewThread);

#if PTHREAD_CREATE_MODIFIES_ERRNO
    if (iError == 0)
    {
        // Restore errno if pthread_create succeeded.
        errno = storedErrno;
    }
#endif  // PTHREAD_CREATE_MODIFIES_ERRNO

    if (0 != iError)
    {
        ERROR("pthread_create failed, error is %d (%s)\n", iError, strerror(iError));
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    //
    // Wait for the new thread to finish its initial startup tasks
    // (i.e., the ones that might fail)
    //
    if (pNewThread->WaitForStartStatus())
    {
        //
        // Everything succeeded. Store the handle for the new thread and
        // the thread's ID in the out params
        //
        *phThread = hNewThread;

        if (NULL != pThreadId)
        {
            *pThreadId = pNewThread->GetThreadId();
        }
    }
    else
    {
        ERROR("error occurred in THREADEntry, thread creation failed.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    //
    // If we're here, then we've locked the process list and both pthread_create
    // and WaitForStartStatus succeeded. Thus, we can now unlock the process list.
    // Since palError == NO_ERROR, we won't call this again in the exit block.
    //
    PROCProcessUnlock();
    fHoldingProcessLock = FALSE;

EXIT:

    if (fAttributesInitialized)
    {
        if (0 != pthread_attr_destroy(&pthreadAttr))
        {
            WARN("pthread_attr_destroy() failed\n");
        }
    }

    if (NO_ERROR != palError)
    {
        //
        // We either were not able to create the new thread, or a failure
        // occurred in the new thread's entry routine. Free up the associated
        // resources here
        //

        if (fThreadDataAddedToProcessList)
        {
            PROCRemoveThread(pThread, pNewThread);
        }
        //
        // Once we remove the thread from the process list, we can call
        // PROCProcessUnlock.
        //
        if (fHoldingProcessLock)
        {
            PROCProcessUnlock();
        }
        fHoldingProcessLock = FALSE;
    }

    _ASSERT_MSG(!fHoldingProcessLock, "Exiting InternalCreateThread while still holding the process critical section.\n");

    return palError;
}